

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_msg_header_trim_u32(nng_msg *msg,uint32_t *val)

{
  byte *pbVar1;
  size_t sVar2;
  uint32_t v;
  uint8_t *header;
  uint32_t *val_local;
  nng_msg *msg_local;
  
  pbVar1 = (byte *)nni_msg_header(msg);
  sVar2 = nng_msg_header_len(msg);
  if (sVar2 < 4) {
    msg_local._4_4_ = 3;
  }
  else {
    *val = (uint)*pbVar1 * 0x1000000 + (uint)pbVar1[1] * 0x10000 + (uint)pbVar1[2] * 0x100 +
           (uint)pbVar1[3];
    nni_msg_header_trim(msg,4);
    msg_local._4_4_ = 0;
  }
  return msg_local._4_4_;
}

Assistant:

int
nng_msg_header_trim_u32(nng_msg *msg, uint32_t *val)
{
	uint8_t *header = nni_msg_header(msg);
	uint32_t v;
	if (nng_msg_header_len(msg) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	NNI_GET32(header, v);
	*val = v;
	nni_msg_header_trim(msg, sizeof(v));
	return (0);
}